

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O2

void FFT(NoiseSuppressionC *self,float *time_data,size_t time_data_length,size_t magnitude_length,
        float *real,float *imag,float *magn,float *lmagn,int prev_calc,float *signalEnergy,
        float *sumMagn)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  
  if ((time_data_length >> 1) + 1 == magnitude_length) {
    WebRtc_rdft(time_data_length,1,time_data,self->ip,self->wfft);
    *imag = 0.0;
    fVar2 = *time_data;
    *real = fVar2;
    *magn = ABS(fVar2) + 1.0;
    imag[magnitude_length - 1] = 0.0;
    fVar2 = time_data[1];
    real[magnitude_length - 1] = fVar2;
    magn[magnitude_length - 1] = ABS(fVar2) + 1.0;
    if (prev_calc == 1) {
      fVar2 = *real * *real + *imag * *imag;
      fVar3 = real[magnitude_length - 1] * real[magnitude_length - 1] +
              imag[magnitude_length - 1] * imag[magnitude_length - 1];
      *signalEnergy = fVar2 + fVar3;
      *sumMagn = SQRT(fVar3) + SQRT(fVar2) + 2.0;
      fVar2 = logf(*magn);
      *lmagn = fVar2;
      fVar2 = logf(magn[magnitude_length - 1]);
      lmagn[magnitude_length - 1] = fVar2;
      for (uVar1 = 1; uVar1 < magnitude_length - 1; uVar1 = uVar1 + 1) {
        real[uVar1] = time_data[uVar1 * 2];
        fVar2 = time_data[uVar1 * 2 + 1];
        imag[uVar1] = fVar2;
        fVar2 = real[uVar1] * real[uVar1] + fVar2 * fVar2;
        *signalEnergy = fVar2 + *signalEnergy;
        fVar2 = SQRT(fVar2) + 1.0;
        magn[uVar1] = fVar2;
        *sumMagn = fVar2 + *sumMagn;
        fVar2 = logf(magn[uVar1]);
        lmagn[uVar1] = fVar2;
      }
    }
    else {
      for (uVar1 = 1; uVar1 < magnitude_length - 1; uVar1 = uVar1 + 1) {
        real[uVar1] = time_data[uVar1 * 2];
        fVar2 = time_data[uVar1 * 2 + 1];
        imag[uVar1] = fVar2;
        magn[uVar1] = SQRT(real[uVar1] * real[uVar1] + fVar2 * fVar2) + 1.0;
      }
    }
    return;
  }
  __assert_fail("magnitude_length == time_data_length / 2 + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/src/ns.c"
                ,0x611,
                "void FFT(NoiseSuppressionC *, float *, size_t, size_t, float *, float *, float *, float *, int, float *, float *)"
               );
}

Assistant:

static void FFT(NoiseSuppressionC *self, float *time_data, size_t time_data_length, size_t magnitude_length,
                float *real, float *imag, float *magn, float *lmagn, int prev_calc, float *signalEnergy,
                float *sumMagn) {
    size_t i;

    assert(magnitude_length == time_data_length / 2 + 1);

    WebRtc_rdft(time_data_length, 1, time_data, self->ip, self->wfft);

    imag[0] = 0;
    real[0] = time_data[0];
    magn[0] = fabsf(real[0]) + 1.f;
    imag[magnitude_length - 1] = 0;
    real[magnitude_length - 1] = time_data[1];
    magn[magnitude_length - 1] = fabsf(real[magnitude_length - 1]) + 1.f;
    float *time_data_ptr = time_data + 2;
    if (prev_calc == 1) {
        float first = real[0] * real[0] + imag[0] * imag[0];
        float last = real[magnitude_length - 1] * real[magnitude_length - 1] +
                     imag[magnitude_length - 1] * imag[magnitude_length - 1];
        *signalEnergy = first + last;
        *sumMagn = sqrtf(first) + 2.f + sqrtf(last);
        lmagn[0] = logf(magn[0]);
        lmagn[magnitude_length - 1] = logf(magn[magnitude_length - 1]);
        for (i = 1; i < magnitude_length - 1; ++i) {
            real[i] = time_data_ptr[0];
            imag[i] = time_data_ptr[1];
            const float energy = real[i] * real[i] + imag[i] * imag[i];
            *signalEnergy += energy;
            // Magnitude spectrum.
            magn[i] = sqrtf(energy) + 1.f;
            *sumMagn += magn[i];
            lmagn[i] = logf(magn[i]);
            time_data_ptr += 2;
        }
    } else {
        for (i = 1; i < magnitude_length - 1; ++i) {
            real[i] = time_data_ptr[0];
            imag[i] = time_data_ptr[1];
            // Magnitude spectrum.
            magn[i] = sqrtf(real[i] * real[i] + imag[i] * imag[i]) + 1.f;
            time_data_ptr += 2;
        }
    }
}